

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

char * Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *p,char *pInit)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Wlc_Obj_t *pWVar4;
  size_t sVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int i;
  int iVar11;
  
  pcVar3 = Abc_UtilStrsav(pInit);
  iVar11 = 0;
  iVar9 = 0;
  for (i = 0; i < (p->vCis).nSize; i = i + 1) {
    pWVar4 = Wlc_NtkCi(p,i);
    uVar6 = *(ushort *)pWVar4 & 0x3f;
    if ((char)*(ushort *)pWVar4 < '\0' && uVar6 != 1) {
      uVar8 = 0;
      while( true ) {
        uVar10 = pWVar4->End - pWVar4->Beg;
        uVar1 = -uVar10;
        if (0 < (int)uVar10) {
          uVar1 = uVar10;
        }
        if (uVar1 < uVar8) break;
        pcVar3[uVar8 + (long)iVar9] = pcVar3[uVar8 + (long)iVar11];
        uVar8 = uVar8 + 1;
      }
      iVar9 = iVar9 + (int)uVar8;
      uVar6 = *(ushort *)pWVar4 & 0x3f;
    }
    if (uVar6 != 1) {
      iVar7 = pWVar4->End - pWVar4->Beg;
      iVar2 = -iVar7;
      if (0 < iVar7) {
        iVar2 = iVar7;
      }
      iVar11 = iVar11 + iVar2 + 1;
    }
  }
  pcVar3[iVar9] = '\0';
  sVar5 = strlen(pInit);
  if (iVar11 == (int)sVar5) {
    return pcVar3;
  }
  __assert_fail("nBits == (int)strlen(pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                ,0x379,"char *Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *, char *)");
}

Assistant:

char * Wlc_ReduceMarkedInitStr( Wlc_Ntk_t * p, char * pInit )
{
    char * pInitNew = Abc_UtilStrsav( pInit );
    Wlc_Obj_t * pObj; int i, b, nBits = 0, k = 0;
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            for ( b = 0; b < Wlc_ObjRange(pObj); b++ )
                pInitNew[k++] = pInitNew[nBits+b];
        if ( !Wlc_ObjIsPi(pObj) )
            nBits += Wlc_ObjRange(pObj);
    }
    pInitNew[k] = '\0';
    assert( nBits == (int)strlen(pInit) );
    return pInitNew;
}